

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

void __thiscall
phyr::SurfaceInteraction::SurfaceInteraction
          (SurfaceInteraction *this,Point3f *p,Vector3f *wo,Vector3f *pfError,Point2f *uv,
          Vector3f *dpdu,Vector3f *dpdv,Normal3f *dndu,Normal3f *dndv,Shape *shape)

{
  double dVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  Normal3<double> local_68;
  Normal3<double> local_48;
  
  cross<double>(dpdu,dpdv);
  normalize<double>(&local_48,&local_68);
  (this->super_Interaction).p.z = p->z;
  dVar1 = p->y;
  (this->super_Interaction).p.x = p->x;
  (this->super_Interaction).p.y = dVar1;
  (this->super_Interaction).n.z = local_48.z;
  (this->super_Interaction).n.x = local_48.x;
  (this->super_Interaction).n.y = local_48.y;
  (this->super_Interaction).wo.z = wo->z;
  dVar1 = wo->y;
  (this->super_Interaction).wo.x = wo->x;
  (this->super_Interaction).wo.y = dVar1;
  dVar1 = pfError->y;
  (this->super_Interaction).pfError.x = pfError->x;
  (this->super_Interaction).pfError.y = dVar1;
  (this->super_Interaction).pfError.z = pfError->z;
  dVar1 = uv->y;
  (this->uv).x = uv->x;
  (this->uv).y = dVar1;
  (this->dpdu).z = dpdu->z;
  dVar1 = dpdu->y;
  (this->dpdu).x = dpdu->x;
  (this->dpdu).y = dVar1;
  (this->dpdv).z = dpdv->z;
  dVar1 = dpdv->y;
  (this->dpdv).x = dpdv->x;
  (this->dpdv).y = dVar1;
  (this->dndu).z = dndu->z;
  dVar1 = dndu->y;
  (this->dndu).x = dndu->x;
  (this->dndu).y = dVar1;
  dVar1 = dndv->y;
  (this->dndv).x = dndv->x;
  (this->dndv).y = dVar1;
  (this->dndv).z = dndv->z;
  this->bsdf = (BSDF *)0x0;
  this->shape = shape;
  memset(&this->object,0,0xd0);
  (this->shadingGeom).n.z = (this->super_Interaction).n.z;
  dVar1 = (this->super_Interaction).n.y;
  (this->shadingGeom).n.x = (this->super_Interaction).n.x;
  (this->shadingGeom).n.y = dVar1;
  (this->shadingGeom).dpdu.z = dpdu->z;
  dVar1 = dpdu->y;
  (this->shadingGeom).dpdu.x = dpdu->x;
  (this->shadingGeom).dpdu.y = dVar1;
  (this->shadingGeom).dpdv.z = dpdv->z;
  dVar1 = dpdv->y;
  (this->shadingGeom).dpdv.x = dpdv->x;
  (this->shadingGeom).dpdv.y = dVar1;
  dVar1 = dndu->y;
  (this->shadingGeom).dndu.x = dndu->x;
  (this->shadingGeom).dndu.y = dVar1;
  (this->shadingGeom).dndu.z = dndu->z;
  dVar1 = dndv->y;
  (this->shadingGeom).dndv.x = dndv->x;
  (this->shadingGeom).dndv.y = dVar1;
  (this->shadingGeom).dndv.z = dndv->z;
  (this->shadingGeom).overridesOrientation = false;
  if ((shape != (Shape *)0x0) && (shape->reverseNormals != shape->transformChangesCoordSys)) {
    dVar1 = (this->super_Interaction).n.z;
    uVar2 = *(uint *)((long)&(this->super_Interaction).n.x + 4);
    uVar3 = *(undefined4 *)&(this->super_Interaction).n.y;
    uVar4 = *(uint *)((long)&(this->super_Interaction).n.y + 4);
    *(undefined4 *)&(this->super_Interaction).n.x = *(undefined4 *)&(this->super_Interaction).n.x;
    *(uint *)((long)&(this->super_Interaction).n.x + 4) = uVar2 ^ 0x80000000;
    *(undefined4 *)&(this->super_Interaction).n.y = uVar3;
    *(uint *)((long)&(this->super_Interaction).n.y + 4) = uVar4 ^ 0x80000000;
    (this->super_Interaction).n.z = -dVar1;
    dVar1 = (this->shadingGeom).n.z;
    uVar2 = *(uint *)((long)&(this->shadingGeom).n.x + 4);
    uVar3 = *(undefined4 *)&(this->shadingGeom).n.y;
    uVar4 = *(uint *)((long)&(this->shadingGeom).n.y + 4);
    *(undefined4 *)&(this->shadingGeom).n.x = *(undefined4 *)&(this->shadingGeom).n.x;
    *(uint *)((long)&(this->shadingGeom).n.x + 4) = uVar2 ^ 0x80000000;
    *(undefined4 *)&(this->shadingGeom).n.y = uVar3;
    *(uint *)((long)&(this->shadingGeom).n.y + 4) = uVar4 ^ 0x80000000;
    (this->shadingGeom).n.z = -dVar1;
  }
  return;
}

Assistant:

SurfaceInteraction::SurfaceInteraction(const Point3f& p,
                   const Vector3f& wo, const Vector3f& pfError,
                   const Point2f& uv, const Vector3f& dpdu, const Vector3f& dpdv,
                   const Normal3f& dndu, const Normal3f& dndv, const Shape* shape) :
    Interaction(p, normalize(Normal3f(cross(dpdu, dpdv))), wo, pfError), uv(uv), dpdu(dpdu),
    dpdv(dpdv), dndu(dndu), dndv(dndv), shape(shape) {
    // Initialize shading geometry from true geometry
    shadingGeom.n = n;
    shadingGeom.dpdu = dpdu; shadingGeom.dpdv = dpdv;
    shadingGeom.dndu = dndu; shadingGeom.dndv = dndv;
    shadingGeom.overridesOrientation = false;

    // Adjust normals if either shape assumes reversed normals
    // or shape transformation changes coordinate system but not both
    if (shape && (shape->reverseNormals ^ shape->transformChangesCoordSys)) {
        // Flip normals
        n = -n; shadingGeom.n = -shadingGeom.n;
    }
}